

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchquestion(regex_t p,regex_t *pattern,char *text)

{
  int iVar1;
  regex_t p_00;
  char *text_local;
  regex_t *pattern_local;
  regex_t p_local;
  
  p_00.field_1 = p.field_1;
  if (p.type == 0) {
    p_local.field_1._4_4_ = 1;
  }
  else {
    iVar1 = matchpattern(pattern,text);
    if (iVar1 == 0) {
      if (*text != '\0') {
        p_00._1_7_ = 0;
        p_00.type = p.type;
        iVar1 = matchone(p_00,*text);
        if (iVar1 != 0) {
          iVar1 = matchpattern(pattern,text + 1);
          return iVar1;
        }
      }
      p_local.field_1._4_4_ = 0;
    }
    else {
      p_local.field_1._4_4_ = 1;
    }
  }
  return p_local.field_1._4_4_;
}

Assistant:

static int matchquestion(regex_t p, regex_t* pattern, const char* text)
{
  if (p.type == UNUSED)
    return 1;
  if (matchpattern(pattern, text))
      return 1;
  if (*text && matchone(p, *text++))
    return matchpattern(pattern, text);
  return 0;
}